

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.h
# Opt level: O2

uint16 Js::PolymorphicInlineCache::GetNextSize(uint16 currentSize)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint16 uVar4;
  int iVar5;
  undefined6 in_register_0000003a;
  
  iVar5 = (int)CONCAT62(in_register_0000003a,currentSize);
  if (iVar5 == 0x20) {
    uVar4 = 0;
  }
  else if (iVar5 == 1) {
    uVar4 = 4;
  }
  else {
    if (0xc < (ushort)(currentSize - 4)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InlineCache.h"
                                  ,0x20d,"(currentSize >= 4 && currentSize <= (32 / 2))",
                                  "currentSize >= MinPolymorphicInlineCacheSize && currentSize <= (MaxPolymorphicInlineCacheSize / 2)"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    uVar4 = currentSize * 2;
  }
  return uVar4;
}

Assistant:

static uint16 GetNextSize(uint16 currentSize)
        {
            if (currentSize == MaxPolymorphicInlineCacheSize)
            {
                return 0;
            }
            else if (currentSize == MinPropertyStringInlineCacheSize)
            {
                CompileAssert(MinPropertyStringInlineCacheSize < MinPolymorphicInlineCacheSize);
                return MinPolymorphicInlineCacheSize;
            }
            else
            {
                Assert(currentSize >= MinPolymorphicInlineCacheSize && currentSize <= (MaxPolymorphicInlineCacheSize / 2));
                return currentSize * 2;
            }
        }